

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::reset(CompilerGLSL *this)

{
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  local_10 = this;
  Compiler::clear_force_recompile(&this->super_Compiler);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).invalid_expressions);
  (this->super_Compiler).current_function = (SPIRFunction *)0x0;
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&this->expression_usage_counts);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).forwarded_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).suppressed_usage_tracking);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->flushed_phi_variables);
  reset_name_caches(this);
  ParsedIR::for_each_typed_id<spirv_cross::SPIRFunction,spirv_cross::CompilerGLSL::reset()::__0>
            (&(this->super_Compiler).ir,&local_11);
  ParsedIR::for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::reset()::__1>
            (&(this->super_Compiler).ir,&local_12);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRExpression>(&(this->super_Compiler).ir);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRAccessChain>(&(this->super_Compiler).ir);
  this->statement_count = 0;
  this->indent = 0;
  (this->super_Compiler).current_loop_level = 0;
  return;
}

Assistant:

void CompilerGLSL::reset()
{
	// We do some speculative optimizations which should pretty much always work out,
	// but just in case the SPIR-V is rather weird, recompile until it's happy.
	// This typically only means one extra pass.
	clear_force_recompile();

	// Clear invalid expression tracking.
	invalid_expressions.clear();
	current_function = nullptr;

	// Clear temporary usage tracking.
	expression_usage_counts.clear();
	forwarded_temporaries.clear();
	suppressed_usage_tracking.clear();

	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	flushed_phi_variables.clear();

	reset_name_caches();

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.active = false;
		func.flush_undeclared = true;
	});

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) { var.dependees.clear(); });

	ir.reset_all_of_type<SPIRExpression>();
	ir.reset_all_of_type<SPIRAccessChain>();

	statement_count = 0;
	indent = 0;
	current_loop_level = 0;
}